

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O0

void __thiscall libcalc::Token::Token(Token *this)

{
  Token *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->type = '\0';
  return;
}

Assistant:

Token::Token() { }